

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layered_toon_shader.cpp
# Opt level: O2

void vec3_layer(float *r,float *maxr,float max_n,float n)

{
  float fVar1;
  vec3 cadd;
  float local_1c [3];
  
  r[0] = 0.0;
  r[1] = 0.0;
  r[2] = 0.0;
  vec3_scale(local_1c,maxr,1.0 / max_n);
  for (fVar1 = 0.0; fVar1 < n; fVar1 = fVar1 + 1.0) {
    vec3_add(r,r,local_1c);
  }
  return;
}

Assistant:

void vec3_layer(vec3 r, const vec3 maxr, const float max_n, const float n){
    //set to lowest layer color
    r[0] = 0.0f;
    r[1] = 0.0f;
    r[2] = 0.0f;

    //a color add for each layer
    vec3 cadd;
    vec3_scale(cadd, maxr, 1/max_n);

    //cal current layer color
    for(float i=0.0f; i<n; i+=1.0f){
        vec3_add(r, r, cadd);
    }
}